

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O0

void __thiscall CEAngle::SetAngle(CEAngle *this,char *angle_str,CEAngleType *angle_type,char *delim)

{
  char cVar1;
  initializer_list<char> __l;
  CEAngleType CVar2;
  bool bVar3;
  size_type sVar4;
  undefined8 uVar5;
  reference pcVar6;
  CEAngleType *in_RCX;
  int *in_RDX;
  string *in_RSI;
  CEAngleType *in_RDI;
  char d;
  iterator __end4;
  iterator __begin4;
  vector<char,_std::allocator<char>_> *__range4;
  vector<char,_std::allocator<char>_> delim_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ang;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<double,_std::allocator<double>_> angle_dbl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  angle_vec;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  allocator *paVar7;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  allocator_type *in_stack_fffffffffffffde8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  iterator in_stack_fffffffffffffdf8;
  size_type in_stack_fffffffffffffe00;
  string *message;
  string *in_stack_fffffffffffffe18;
  invalid_delimiter *in_stack_fffffffffffffe20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe38;
  CEAngle *in_stack_fffffffffffffe40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_190;
  undefined1 *local_188;
  undefined1 local_17b [11];
  undefined8 local_170;
  undefined1 local_168 [24];
  double local_150;
  reference local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined1 *local_130;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [71];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  char *in_stack_ffffffffffffffd8;
  
  if ((*in_RDX == 0) || (*in_RDX == 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,(char *)in_RSI,&local_49);
    std::__cxx11::stod(in_stack_fffffffffffffdc0,(size_t *)in_stack_fffffffffffffdb8);
    SetAngle(in_stack_fffffffffffffe40,(double *)in_stack_fffffffffffffe38,in_RDI);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else {
    message = (string *)&stack0xffffffffffffff88;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x122ee8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
    if ((char)*in_RCX == DEGREES) {
      if ((char)*in_RCX == DEGREES) {
        local_17b[1] = 0x3a;
        local_17b[2] = 0x20;
        local_17b._3_8_ = local_17b + 1;
        local_170 = 2;
        in_stack_fffffffffffffdd0 = (vector<char,_std::allocator<char>_> *)local_17b;
        std::allocator<char>::allocator();
        __l._M_len = in_stack_fffffffffffffe00;
        __l._M_array = in_stack_fffffffffffffdf8;
        std::vector<char,_std::allocator<char>_>::vector
                  (in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
        std::allocator<char>::~allocator((allocator<char> *)local_17b);
        local_188 = local_17b + 0x13;
        local_190._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffdb8);
        std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffdb8);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffffdc0,
                                  (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffffdb8), bVar3) {
          in_stack_fffffffffffffdc0 = in_RSI;
          pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_190);
          cVar1 = *pcVar6;
          paVar7 = (allocator *)&stack0xfffffffffffffe3f;
          in_RSI = in_stack_fffffffffffffdc0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffe40,(char *)in_stack_fffffffffffffdc0,paVar7);
          in_stack_fffffffffffffdb8 =
               (vector<char,_std::allocator<char>_> *)
               std::__cxx11::string::find((char)&stack0xfffffffffffffe40,(ulong)(uint)(int)cVar1);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
          if (in_stack_fffffffffffffdb8 != (vector<char,_std::allocator<char>_> *)0xffffffffffffffff
             ) {
            SetAngle((CEAngle *)in_RSI,(char *)in_RDX,in_RCX,in_stack_ffffffffffffffd8);
          }
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&local_190);
        }
        std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffdd0);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,(char *)in_RSI,&local_99);
      CppEphem::StrOpt::split
                (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffff88);
      if (sVar4 < 3) {
        local_10a = 1;
        uVar5 = __cxa_allocate_exception(0xa8);
        paVar7 = &local_c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_c0,"CEAngle::SetAngle(const string&, const CEAngleType&, const char&)",
                   paVar7);
        CVar2 = *in_RCX;
        paVar7 = &local_109;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,1,(char)CVar2,paVar7);
        std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        CEException::invalid_delimiter::invalid_delimiter
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,message);
        local_10a = 0;
        __cxa_throw(uVar5,&CEException::invalid_delimiter::typeinfo,
                    CEException::invalid_delimiter::~invalid_delimiter);
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x123197);
      local_130 = &stack0xffffffffffffff88;
      local_138._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffdb8);
      local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffdb8);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdc0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdb8), bVar3) {
        local_148 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_138);
        local_150 = std::__cxx11::stod(in_stack_fffffffffffffdc0,(size_t *)in_stack_fffffffffffffdb8
                                      );
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
                   (value_type *)in_stack_fffffffffffffdb8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_138);
      }
      SetAngle(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_RDI);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdd0);
  }
  return;
}

Assistant:

void CEAngle::SetAngle(const char*        angle_str,
                       const CEAngleType& angle_type,
                       const char&        delim)
{
    // Angle is a degree or radian
    if ((angle_type == CEAngleType::DEGREES) || (angle_type == CEAngleType::RADIANS)) {
        SetAngle(std::stod(angle_str), angle_type);
    }

    // Otherwise the angle is a delimited string (i.e. something like HH:MM:SS)
    else {

        // Create a string vector to hold the parsed values
        std::vector<std::string> angle_vec;
        angle_vec.reserve(4);

        // Handle specific delimitors
        if (delim != 0) {

            // Split the string
            CppEphem::StrOpt::split(angle_str, delim, &angle_vec);

            // Throw an error if the string was not properly split
            if (angle_vec.size() < 3) {
                throw CEException::invalid_delimiter(
                    "CEAngle::SetAngle(const string&, const CEAngleType&, const char&)",
                    "Could not find specified delimiter: " + std::string(1,delim));
            }

            // Now format the string in the appropriate way
            std::vector<double> angle_dbl;
            for (auto& ang : angle_vec) {
                angle_dbl.push_back(std::stod(ang));
            }
            SetAngle(angle_dbl, angle_type);
        } 

        // Handle delimiter agnostic format
        else if (delim == 0) {

            // Create vector of delimiters to be tried
            std::vector<char> delim_list = {':', ' '};

            // Loop through the list of delimiters
            for (char d : delim_list) {
                // Check if the delimiter is in the string
                if (std::string(angle_str).find(d) != std::string::npos) {
                    // Try to set the angle
                    SetAngle(angle_str, angle_type, d);
                }
            }
        }
    }

    return;
}